

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

string * __thiscall
google::protobuf::Reflection::GetString_abi_cxx11_
          (string *__return_storage_ptr__,Reflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  byte bVar1;
  pointer pcVar2;
  void *pvVar3;
  long lVar4;
  uint32_t uVar5;
  CppStringType CVar6;
  Cord **ppCVar7;
  string *psVar8;
  ArenaStringPtr *pAVar9;
  Cord *this_01;
  Nonnull<const_char_*> pcVar10;
  bool bVar11;
  char *description;
  OneofDescriptor *oneof_descriptor;
  Descriptor *pDVar12;
  Metadata MVar13;
  
  MVar13 = Message::GetMetadata(message);
  if (MVar13.reflection != this) {
    pDVar12 = this->descriptor_;
    MVar13 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar12,MVar13.descriptor,field,"GetString");
  }
  pDVar12 = this->descriptor_;
  if (field->containing_type_ == pDVar12) {
    bVar1 = field->field_0x1;
    bVar11 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar11) {
      pcVar10 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar10 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
          anon_unknown_6::ReportReflectionUsageTypeError
                    (this->descriptor_,field,"GetString",CPPTYPE_STRING);
        }
        this_00 = &this->schema_;
        if ((field->field_0x1 & 8) == 0) {
          bVar11 = internal::ReflectionSchema::InRealOneof(this_00,field);
          if (bVar11) {
            if ((field->field_0x1 & 0x10) == 0) {
              oneof_descriptor = (OneofDescriptor *)0x0;
            }
            else {
              oneof_descriptor = (field->scope_).containing_oneof;
              if (oneof_descriptor == (OneofDescriptor *)0x0) goto LAB_001f501c;
            }
            uVar5 = GetOneofCase(this,message,oneof_descriptor);
            if (uVar5 != field->number_) goto LAB_001f4f56;
          }
          CVar6 = FieldDescriptor::cpp_string_type(field);
          if ((CVar6 != kView) && (CVar6 != kString)) {
            if (CVar6 == kCord) {
              bVar11 = internal::ReflectionSchema::InRealOneof(this_00,field);
              if (bVar11) {
                ppCVar7 = GetRaw<absl::lts_20250127::Cord*>(this,message,field);
                this_01 = *ppCVar7;
              }
              else {
                this_01 = GetRaw<absl::lts_20250127::Cord>(this,message,field);
              }
              absl::lts_20250127::Cord::operator_cast_to_string(__return_storage_ptr__,this_01);
              return __return_storage_ptr__;
            }
            GetString_abi_cxx11_();
LAB_001f501c:
            internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb31);
          }
          bVar11 = internal::ReflectionSchema::IsFieldInlined(this_00,field);
          if (bVar11) {
            psVar8 = (string *)
                     GetRaw<google::protobuf::internal::InlinedStringField>(this,message,field);
          }
          else {
            pAVar9 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
            pvVar3 = (pAVar9->tagged_ptr_).ptr_;
            if (((ulong)pvVar3 & 3) == 0) {
LAB_001f4f56:
              lVar4 = *(long *)(field->field_20).default_value_enum_;
              psVar8 = ((field->field_20).default_value_enum_)->all_names_;
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)__return_storage_ptr__,lVar4,
                         (long)&(psVar8->_M_dataplus)._M_p + lVar4);
              return __return_storage_ptr__;
            }
            psVar8 = (string *)((ulong)pvVar3 & 0xfffffffffffffffc);
          }
        }
        else {
          uVar5 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
          psVar8 = internal::ExtensionSet::GetString
                             ((ExtensionSet *)
                              ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5)
                              ,field->number_,(field->field_20).default_value_string_);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar2 = (psVar8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar8->_M_string_length);
        return __return_storage_ptr__;
      }
    }
    else {
      GetString_abi_cxx11_();
    }
    pDVar12 = this->descriptor_;
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar12,field,"GetString",description);
}

Assistant:

std::string Reflection::GetString(const Message& message,
                                  const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(
        field->number(), internal::DefaultValueStringAsString(field));
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return std::string(field->default_value_string());
    }
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          return std::string(*GetField<absl::Cord*>(message, field));
        } else {
          return std::string(GetField<absl::Cord>(message, field));
        }
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        if (IsInlined(field)) {
          return GetField<InlinedStringField>(message, field).GetNoArena();
        } else if (IsMicroString(field)) {
          return std::string(GetField<MicroString>(message, field).Get());
        } else {
          const auto& str = GetField<ArenaStringPtr>(message, field);
          return str.IsDefault() ? std::string(field->default_value_string())
                                 : str.Get();
        }
    }
    internal::Unreachable();
  }
}